

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O0

bool __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::terminate(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this)

{
  type_conflict5 tVar1;
  bool bVar2;
  int iVar3;
  Type TVar4;
  Verbosity VVar5;
  Pricing PVar6;
  SPxStatus SVar7;
  Representation RVar8;
  uint uVar9;
  element_type *peVar10;
  cpp_dec_float<200U,_int,_void> *pcVar11;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity_1;
  Verbosity old_verbosity;
  int redo;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_5;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_4;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffff498;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffff4a0;
  undefined2 in_stack_fffffffffffff4a8;
  undefined1 in_stack_fffffffffffff4aa;
  type_conflict5 tVar12;
  undefined1 in_stack_fffffffffffff4ab;
  byte bVar13;
  Type in_stack_fffffffffffff4ac;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff4b0;
  Type local_b34;
  Representation local_b30;
  SPxSense local_b2c;
  undefined1 local_b28 [72];
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff520;
  undefined1 in_stack_fffffffffffff547;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff548;
  undefined1 local_aa8 [128];
  undefined4 local_a28;
  Verbosity local_a24;
  SPxSense local_a20;
  undefined1 local_a1c [84];
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff638;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_99c;
  SPxSense local_91c;
  undefined1 local_918 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_898;
  Real local_818;
  undefined1 local_810 [176];
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff8a0;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff8b0;
  undefined1 local_710 [128];
  SPxSense local_690;
  undefined1 local_68c [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_60c;
  SPxSense local_58c;
  undefined1 local_588 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_508;
  Real local_488;
  undefined1 local_480 [256];
  undefined1 local_380 [128];
  undefined1 local_300 [128];
  undefined4 local_280;
  Verbosity local_27c [4];
  undefined1 local_26c [128];
  undefined4 local_1ec;
  Verbosity local_1e8;
  int local_1e4;
  bool local_1d1;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined1 *local_1c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1b8;
  undefined1 *local_1b0;
  undefined8 local_1a8;
  long local_1a0;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_191;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_190;
  SPxSense *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  SPxSense *local_170;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_168;
  undefined1 *local_160;
  long local_158;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_149;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_148;
  SPxSense *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  SPxSense *local_128;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_120;
  undefined1 *local_118;
  long local_110;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_101;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_100;
  SPxSense *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  SPxSense *local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  undefined1 *local_d0;
  long local_c8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_b9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  SPxSense *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  SPxSense *local_98;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_90;
  undefined1 *local_88;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_79;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  Real *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  undefined1 *local_50;
  Real *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  Real *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined1 *local_10;
  Real *local_8;
  
  local_1e4 = dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x667f31);
  if (local_1e4 < 1000) {
    local_1e4 = 1000;
  }
  iVar3 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::iteration(&in_RDI->
                       super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     );
  if ((10 < iVar3) &&
     (iVar3 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::iteration(&in_RDI->
                           super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ), iVar3 % local_1e4 == 0)) {
    TVar4 = type(in_RDI);
    if (TVar4 == ENTER) {
      (*(in_RDI->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x7c])();
    }
    else {
      (*(in_RDI->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x7d])();
    }
    computeFrhs(in_stack_fffffffffffff638);
    if (1 < (in_RDI->
            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).updateCount) {
      if ((in_RDI->spxout != (SPxOut *)0x0) &&
         (VVar5 = SPxOut::getVerbosity(in_RDI->spxout), 4 < (int)VVar5)) {
        local_1e8 = SPxOut::getVerbosity(in_RDI->spxout);
        local_1ec = 5;
        (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_1ec);
        soplex::operator<<((SPxOut *)in_stack_fffffffffffff4a0,(char *)in_stack_fffffffffffff498);
        soplex::operator<<((SPxOut *)in_stack_fffffffffffff4a0,
                           (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff498);
        (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_1e8);
      }
      (*(in_RDI->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x75])();
    }
    SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::coSolve(in_stack_fffffffffffff4b0,
              (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)CONCAT44(in_stack_fffffffffffff4ac,
                          CONCAT13(in_stack_fffffffffffff4ab,
                                   CONCAT12(in_stack_fffffffffffff4aa,in_stack_fffffffffffff4a8))),
              (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)in_stack_fffffffffffff4a0);
    SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::solve(in_stack_fffffffffffff4b0,
            (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)CONCAT44(in_stack_fffffffffffff4ac,
                        CONCAT13(in_stack_fffffffffffff4ab,
                                 CONCAT12(in_stack_fffffffffffff4aa,in_stack_fffffffffffff4a8))),
            (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)in_stack_fffffffffffff4a0);
    PVar6 = pricing(in_RDI);
    if (PVar6 == FULL) {
      computePvec(in_stack_fffffffffffff520);
      TVar4 = type(in_RDI);
      if (TVar4 == ENTER) {
        computeCoTest(in_stack_fffffffffffff8a0);
        computeTest(in_stack_fffffffffffff8b0);
      }
    }
    (*(in_RDI->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x6d])(local_26c);
    local_27c[1] = ERROR;
    local_27c[2] = ERROR;
    tVar1 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff498,(double *)0x668151);
    if (tVar1) {
      (*(in_RDI->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x6e])();
    }
  }
  SVar7 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::status(&in_RDI->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  );
  if ((SVar7 < OPTIMAL) &&
     (SVar7 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::status(&in_RDI->
                        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ), (uint)SVar7 < 0x80000000)) {
    bVar2 = isTimeLimitReached(in_stack_fffffffffffff548,(bool)in_stack_fffffffffffff547);
    if (bVar2) {
      if ((in_RDI->spxout != (SPxOut *)0x0) &&
         (VVar5 = SPxOut::getVerbosity(in_RDI->spxout), 3 < (int)VVar5)) {
        local_27c[0] = SPxOut::getVerbosity(in_RDI->spxout);
        local_280 = 4;
        (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_280);
        soplex::operator<<((SPxOut *)in_stack_fffffffffffff4a0,(char *)in_stack_fffffffffffff498);
        soplex::operator<<((SPxOut *)in_stack_fffffffffffff4a0,(double)in_stack_fffffffffffff498);
        soplex::operator<<((SPxOut *)in_stack_fffffffffffff4a0,(char *)in_stack_fffffffffffff498);
        soplex::operator<<((SPxOut *)in_stack_fffffffffffff4a0,
                           (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff498);
        (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,local_27c);
      }
      in_RDI->m_status = ABORT_TIME;
      local_1d1 = true;
    }
    else {
      pcVar11 = &(in_RDI->objLimit).m_backend;
      local_1c8 = infinity();
      local_1c0 = local_300;
      local_1d0 = 0;
      local_1a8 = local_1c8;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (pcVar11,(double)CONCAT44(in_stack_fffffffffffff4ac,
                                          CONCAT13(in_stack_fffffffffffff4ab,
                                                   CONCAT12(in_stack_fffffffffffff4aa,
                                                            in_stack_fffffffffffff4a8))),
                 in_stack_fffffffffffff4a0);
      tVar1 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffff498,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x668331);
      bVar2 = false;
      if (tVar1) {
        in_stack_fffffffffffff4ac = type(in_RDI);
        RVar8 = rep(in_RDI);
        bVar2 = 0 < in_stack_fffffffffffff4ac * RVar8;
      }
      if (bVar2) {
        (*(in_RDI->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x6d])(local_380);
        epsilon((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)CONCAT44(in_stack_fffffffffffff4ac,
                            CONCAT13(in_stack_fffffffffffff4ab,
                                     CONCAT12(in_stack_fffffffffffff4aa,in_stack_fffffffffffff4a8)))
               );
        tVar1 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_fffffffffffff498,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x6683b5);
        bVar13 = 0;
        if (tVar1) {
          tolerances(in_RDI);
          peVar10 = std::
                    __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x6683d9);
          local_488 = Tolerances::floatingPointOpttol(peVar10);
          (*(in_RDI->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0x6d])(&local_508);
          local_28 = local_480;
          local_30 = &local_488;
          local_38 = &local_508;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_39,local_38);
          local_20 = local_480;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    (in_stack_fffffffffffff4a0);
          local_10 = local_480;
          local_8 = local_30;
          local_18 = local_38;
          boost::multiprecision::default_ops::
          eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (in_stack_fffffffffffff4a0,(double *)in_stack_fffffffffffff498,
                     (cpp_dec_float<200U,_int,_void> *)0x6684af);
          iVar3 = (*(in_RDI->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .
                    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._vptr_ClassArray[0x74])(in_RDI,local_480);
          bVar13 = (byte)iVar3;
        }
        if ((bVar13 & 1) != 0) {
          local_58c = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::spxSense(&in_RDI->
                                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                );
          (*(in_RDI->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0x5e])(&local_60c);
          local_a8 = local_588;
          local_b0 = &local_58c;
          local_b8 = &local_60c;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_b9,local_b8);
          local_a0 = local_588;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    (in_stack_fffffffffffff4a0);
          local_88 = local_588;
          local_90 = local_b8;
          local_98 = local_b0;
          local_c8 = (long)*local_b0;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
                    (in_stack_fffffffffffff4a0,in_stack_fffffffffffff498,(longlong *)0x6685bf);
          local_690 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::spxSense(&in_RDI->
                                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                );
          local_100 = &in_RDI->objLimit;
          local_f0 = local_68c;
          local_f8 = &local_690;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_101,local_100);
          local_e8 = local_68c;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    (in_stack_fffffffffffff4a0);
          local_d0 = local_68c;
          local_d8 = local_100;
          local_e0 = local_f8;
          local_110 = (long)*local_f8;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
                    (in_stack_fffffffffffff4a0,in_stack_fffffffffffff498,(longlong *)0x668697);
          tVar1 = boost::multiprecision::operator<=
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_fffffffffffff498,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x6686ac);
          if (tVar1) {
            (*(in_RDI->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x5f])();
            (*(in_RDI->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x6d])(local_710);
            epsilon((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)CONCAT44(in_stack_fffffffffffff4ac,
                                CONCAT13(bVar13,CONCAT12(in_stack_fffffffffffff4aa,
                                                         in_stack_fffffffffffff4a8))));
            tVar1 = boost::multiprecision::operator<
                              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)in_stack_fffffffffffff498,
                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)0x668700);
            tVar12 = false;
            if (tVar1) {
              tolerances(in_RDI);
              peVar10 = std::
                        __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x668724);
              local_818 = Tolerances::floatingPointOpttol(peVar10);
              (*(in_RDI->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._vptr_ClassArray[0x6d])(&local_898);
              local_68 = local_810;
              local_70 = &local_818;
              local_78 = &local_898;
              boost::multiprecision::detail::
              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
              ::
              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_79,local_78);
              local_60 = local_810;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                        (in_stack_fffffffffffff4a0);
              local_50 = local_810;
              local_48 = local_70;
              local_58 = local_78;
              boost::multiprecision::default_ops::
              eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        (in_stack_fffffffffffff4a0,(double *)in_stack_fffffffffffff498,
                         (cpp_dec_float<200U,_int,_void> *)0x6687fa);
              uVar9 = (*(in_RDI->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .
                        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._vptr_ClassArray[0x74])(in_RDI,local_810);
              tVar12 = false;
              if ((uVar9 & 1) != 0) {
                local_91c = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::spxSense(&in_RDI->
                                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      );
                (*(in_RDI->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._vptr_ClassArray[0x5e])(&local_99c);
                local_138 = local_918;
                local_140 = &local_91c;
                local_148 = &local_99c;
                boost::multiprecision::detail::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                ::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_149,local_148);
                local_130 = local_918;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                          (in_stack_fffffffffffff4a0);
                local_118 = local_918;
                local_120 = local_148;
                local_128 = local_140;
                local_158 = (long)*local_140;
                boost::multiprecision::default_ops::
                eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
                          (in_stack_fffffffffffff4a0,in_stack_fffffffffffff498,(longlong *)0x66890b)
                ;
                local_a20 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::spxSense(&in_RDI->
                                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      );
                local_190 = &in_RDI->objLimit;
                local_180 = local_a1c;
                local_188 = &local_a20;
                boost::multiprecision::detail::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                ::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_191,local_190);
                local_178 = local_a1c;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                          (in_stack_fffffffffffff4a0);
                local_160 = local_a1c;
                local_168 = local_190;
                local_170 = local_188;
                local_1a0 = (long)*local_188;
                boost::multiprecision::default_ops::
                eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
                          (in_stack_fffffffffffff4a0,in_stack_fffffffffffff498,(longlong *)0x6689e3)
                ;
                tVar12 = boost::multiprecision::operator<=
                                   ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)in_stack_fffffffffffff498,
                                    (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)0x6689f8);
              }
            }
            if (tVar12 != false) {
              if ((in_RDI->spxout != (SPxOut *)0x0) &&
                 (VVar5 = SPxOut::getVerbosity(in_RDI->spxout), 3 < (int)VVar5)) {
                local_a24 = SPxOut::getVerbosity(in_RDI->spxout);
                local_a28 = 4;
                (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_a28);
                pcVar11 = (cpp_dec_float<200U,_int,_void> *)
                          soplex::operator<<((SPxOut *)in_stack_fffffffffffff4a0,
                                             (char *)in_stack_fffffffffffff498);
                local_1b8 = &in_RDI->objLimit;
                local_1b0 = local_aa8;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                          (pcVar11,in_stack_fffffffffffff498);
                soplex::operator<<((SPxOut *)pcVar11,
                                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)in_stack_fffffffffffff498);
                soplex::operator<<((SPxOut *)pcVar11,(char *)in_stack_fffffffffffff498);
                soplex::operator<<((SPxOut *)pcVar11,
                                   (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff498);
                (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_a24);
              }
              (*(in_RDI->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._vptr_ClassArray[0x5e])(local_b28);
              SPxOut::
              debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[57],_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_0>
                        (in_RDI,(char (*) [57])
                                " --- objective value limit reached\n (value:{} limit:{})\n",
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_b28,&in_RDI->objLimit);
              local_b2c = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::spxSense(&in_RDI->
                                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    );
              local_b30 = rep(in_RDI);
              local_b34 = type(in_RDI);
              SPxOut::
              debug<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[31],_int,_int,_int,_0>
                        (in_RDI,(char (*) [31])" (spxSense:{} rep:{} type:{})\n",&local_b2c,
                         &local_b30,&local_b34);
              in_RDI->m_status = ABORT_VALUE;
              return true;
            }
          }
        }
      }
      (in_RDI->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).lastIterCount =
           (in_RDI->
           super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).iterCount;
      local_1d1 = false;
    }
  }
  else {
    in_RDI->m_status = UNKNOWN;
    local_1d1 = true;
  }
  return local_1d1;
}

Assistant:

bool SPxSolverBase<R>::terminate()
{
#ifdef ENABLE_ADDITIONAL_CHECKS

   if(SPxBasisBase<R>::status() > SPxBasisBase<R>::SINGULAR)
      testVecs();

#endif

   int redo = dim();

   if(redo < 1000)
      redo = 1000;

   if(this->iteration() > 10 && this->iteration() % redo == 0)
   {
#ifdef ENABLE_ADDITIONAL_CHECKS
      VectorBase<R> cr(*theCoPrhs);
      VectorBase<R> fr(*theFrhs);
#endif

      if(type() == ENTER)
         computeEnterCoPrhs();
      else
         computeLeaveCoPrhs();

      computeFrhs();

#ifdef ENABLE_ADDITIONAL_CHECKS
      cr -= *theCoPrhs;
      fr -= *theFrhs;

      if(cr.length() > leavetol())
         SPX_MSG_WARNING((*this->spxout), (*this->spxout) << "WSOLVE50 unexpected change of coPrhs "
                         << cr.length() << std::endl;)
         if(fr.length() > entertol())
            SPX_MSG_WARNING((*this->spxout), (*this->spxout) << "WSOLVE51 unexpected change of   Frhs "
                            << fr.length() << std::endl;)
#endif

            if(this->updateCount > 1)
            {
               SPX_MSG_INFO3((*this->spxout), (*this->spxout) << " --- terminate triggers refactorization"
                             << std::endl;)
               factorize();
            }

      SPxBasisBase<R>::coSolve(*theCoPvec, *theCoPrhs);
      SPxBasisBase<R>::solve(*theFvec, *theFrhs);

      if(pricing() == FULL)
      {
         computePvec();

         if(type() == ENTER)
         {
            computeCoTest();
            computeTest();
         }
      }

      if(shift() > 0.0)
         unShift();
   }

   // check time limit and objective limit only for non-terminal bases
   if(SPxBasisBase<R>::status() >= SPxBasisBase<R>::OPTIMAL  ||
         SPxBasisBase<R>::status() <= SPxBasisBase<R>::SINGULAR)
   {
      m_status = UNKNOWN;
      return true;
   }

   if(isTimeLimitReached())
   {
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- timelimit (" << maxTime
                    << ") reached" << std::endl;)
      m_status = ABORT_TIME;
      return true;
   }

   // objLimit is set and we are running DUAL:
   // - objLimit is set if objLimit < R(infinity)
   // - DUAL is running if rep() * type() > 0 == DUAL (-1 == PRIMAL)
   //
   // In this case we have given a objective value limit, e.g, through a
   // MIP solver, and we want stop solving the LP if we figure out that the
   // optimal value of the current LP can not be better then this objective
   // limit. More precisely:
   // - MINIMIZATION Problem
   //   We want stop the solving process if
   //   objLimit <= current objective value of the DUAL LP
   // - MAXIMIZATION Problem
   //   We want stop the solving process if
   //   objLimit >= current objective value of the DUAL LP
   if(objLimit < R(infinity) && type() * rep() > 0)
   {
      // We have no bound shifts; therefore, we can trust the current
      // objective value.
      // It might be even possible to use this termination value in case of
      // bound violations (shifting) but in this case it is quite difficult
      // to determine if we already reached the limit.
      if(shift() < epsilon() && noViols(tolerances()->floatingPointOpttol() - shift()))
      {
         // SPxSense::MINIMIZE == -1, so we have sign = 1 on minimizing
         if(int(this->spxSense()) * value() <= int(this->spxSense()) * objLimit)
         {
            // ensure that solution is accurate
            factorizeAndRecompute();

            // check no violations and objective limit again
            if(shift() < epsilon() && noViols(tolerances()->floatingPointOpttol() - shift())
                  && int(this->spxSense()) * value() <= int(this->spxSense()) * objLimit)
            {
               SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- objective value limit (" << objLimit
                             << ") reached" << std::endl;)
               SPxOut::debug(this, " --- objective value limit reached\n (value:{} limit:{})\n", value(),
                             objLimit);
               SPxOut::debug(this, " (spxSense:{} rep:{} type:{})\n", int(this->spxSense()), int(rep()),
                             int(type()));

               m_status = ABORT_VALUE;
               return true;
            }
         }
      }
   }

   this->lastIterCount = this->iterCount;

   return false;
}